

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>>
::
emplace_new_key<std::basic_string_view<char,std::char_traits<char>>&,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
          (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          basic_string_view<char,_std::char_traits<char>_> *key,ArgTokens *args)

{
  ArgTokens *pAVar1;
  undefined8 uVar2;
  size_t sVar3;
  char *pcVar4;
  pointer pTVar5;
  size_type sVar6;
  undefined7 uVar7;
  sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>>
  sVar8;
  long lVar9;
  EntryPointer psVar10;
  EntryPointer psVar11;
  char cVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_bool>
  pVar15;
  basic_string_view<char,_std::char_traits<char>_> __tmp_1;
  value_type to_insert;
  bool local_58;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens> local_48;
  
  if ((*(long *)(this + 0x10) != 0) &&
     (this[0x19] !=
      (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>>
       )distance_from_desired)) {
    psVar10 = (EntryPointer)(*(long *)(this + 0x20) + 1);
    auVar13._8_4_ = (int)((ulong)psVar10 >> 0x20);
    auVar13._0_8_ = psVar10;
    auVar13._12_4_ = 0x45300000;
    lVar9 = *(long *)(this + 0x10) + 1;
    auVar14._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar14._0_8_ = lVar9;
    auVar14._12_4_ = 0x45300000;
    if ((auVar13._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)psVar10) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x1c) *
        ((auVar14._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0))) {
      cVar12 = current_entry->distance_from_desired;
      if (cVar12 < '\0') {
        pcVar4 = key->_M_str;
        (current_entry->field_1).value.first._M_len = key->_M_len;
        (current_entry->field_1).value.first._M_str = pcVar4;
        sVar6 = (args->super_span<const_slang::parsing::Token,_18446744073709551615UL>).size_;
        (current_entry->field_1).value.second.
        super_span<const_slang::parsing::Token,_18446744073709551615UL>.data_ =
             (args->super_span<const_slang::parsing::Token,_18446744073709551615UL>).data_;
        (current_entry->field_1).value.second.
        super_span<const_slang::parsing::Token,_18446744073709551615UL>.size_ = sVar6;
        uVar7 = *(undefined7 *)&args->field_0x11;
        *(bool *)((long)&current_entry->field_1 + 0x20) = args->isExpanded;
        *(undefined7 *)((long)&current_entry->field_1 + 0x21) = uVar7;
        current_entry->distance_from_desired = distance_from_desired;
      }
      else {
        sVar3 = key->_M_len;
        pcVar4 = key->_M_str;
        pTVar5 = (args->super_span<const_slang::parsing::Token,_18446744073709551615UL>).data_;
        sVar6 = (args->super_span<const_slang::parsing::Token,_18446744073709551615UL>).size_;
        uVar2 = *(undefined8 *)&args->isExpanded;
        current_entry->distance_from_desired = distance_from_desired;
        local_48.first._M_len = (current_entry->field_1).value.first._M_len;
        local_48.first._M_str = (current_entry->field_1).value.first._M_str;
        (current_entry->field_1).value.first._M_len = sVar3;
        (current_entry->field_1).value.first._M_str = pcVar4;
        local_48.second._17_7_ = SUB87((ulong)uVar2 >> 8,0);
        local_48.second.isExpanded = *(bool *)((long)&current_entry->field_1 + 0x20);
        local_48.second.super_span<const_slang::parsing::Token,_18446744073709551615UL>.data_ =
             (current_entry->field_1).value.second.
             super_span<const_slang::parsing::Token,_18446744073709551615UL>.data_;
        local_48.second.super_span<const_slang::parsing::Token,_18446744073709551615UL>.size_ =
             (current_entry->field_1).value.second.
             super_span<const_slang::parsing::Token,_18446744073709551615UL>.size_;
        (current_entry->field_1).value.second.
        super_span<const_slang::parsing::Token,_18446744073709551615UL>.data_ = pTVar5;
        (current_entry->field_1).value.second.
        super_span<const_slang::parsing::Token,_18446744073709551615UL>.size_ = sVar6;
        *(char *)((long)&current_entry->field_1 + 0x20) = (char)uVar2;
        sVar8 = (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>>
                 )(cVar12 + '\x01');
        psVar10 = current_entry + 1;
        cVar12 = current_entry[1].distance_from_desired;
        psVar11 = current_entry;
        if (-1 < cVar12) {
          pAVar1 = &(current_entry->field_1).value.second;
          do {
            psVar11 = psVar10;
            local_58 = local_48.second.isExpanded;
            if (cVar12 < (char)sVar8) {
              psVar11->distance_from_desired = (int8_t)sVar8;
              sVar3 = (psVar11->field_1).value.first._M_len;
              pcVar4 = (psVar11->field_1).value.first._M_str;
              (psVar11->field_1).value.first._M_len = local_48.first._M_len;
              (psVar11->field_1).value.first._M_str = local_48.first._M_str;
              local_48.second.isExpanded = *(bool *)((long)&psVar11->field_1 + 0x20);
              pTVar5 = (psVar11->field_1).value.second.
                       super_span<const_slang::parsing::Token,_18446744073709551615UL>.data_;
              sVar6 = (psVar11->field_1).value.second.
                      super_span<const_slang::parsing::Token,_18446744073709551615UL>.size_;
              *(bool *)((long)&psVar11->field_1 + 0x20) = local_58;
              (psVar11->field_1).value.second.
              super_span<const_slang::parsing::Token,_18446744073709551615UL>.data_ =
                   local_48.second.super_span<const_slang::parsing::Token,_18446744073709551615UL>.
                   data_;
              (psVar11->field_1).value.second.
              super_span<const_slang::parsing::Token,_18446744073709551615UL>.size_ =
                   local_48.second.super_span<const_slang::parsing::Token,_18446744073709551615UL>.
                   size_;
              sVar8 = (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>>
                       )(cVar12 + '\x01');
              local_48.first._M_len = sVar3;
              local_48.first._M_str = pcVar4;
              local_48.second.super_span<const_slang::parsing::Token,_18446744073709551615UL>.data_
                   = pTVar5;
              local_48.second.super_span<const_slang::parsing::Token,_18446744073709551615UL>.size_
                   = sVar6;
            }
            else {
              sVar8 = (sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>,8ul>>
                       )((char)sVar8 + '\x01');
              if (sVar8 == this[0x19]) {
                sVar3 = (current_entry->field_1).value.first._M_len;
                pcVar4 = (current_entry->field_1).value.first._M_str;
                (current_entry->field_1).value.first._M_len = local_48.first._M_len;
                (current_entry->field_1).value.first._M_str = local_48.first._M_str;
                local_48.second.isExpanded = *(bool *)((long)&current_entry->field_1 + 0x20);
                pTVar5 = (pAVar1->super_span<const_slang::parsing::Token,_18446744073709551615UL>).
                         data_;
                sVar6 = (current_entry->field_1).value.second.
                        super_span<const_slang::parsing::Token,_18446744073709551615UL>.size_;
                *(bool *)((long)&current_entry->field_1 + 0x20) = local_58;
                (pAVar1->super_span<const_slang::parsing::Token,_18446744073709551615UL>).data_ =
                     local_48.second.super_span<const_slang::parsing::Token,_18446744073709551615UL>
                     .data_;
                (current_entry->field_1).value.second.
                super_span<const_slang::parsing::Token,_18446744073709551615UL>.size_ =
                     local_48.second.super_span<const_slang::parsing::Token,_18446744073709551615UL>
                     .size_;
                local_48.first._M_len = sVar3;
                local_48.first._M_str = pcVar4;
                local_48.second.super_span<const_slang::parsing::Token,_18446744073709551615UL>.
                data_ = pTVar5;
                local_48.second.super_span<const_slang::parsing::Token,_18446744073709551615UL>.
                size_ = sVar6;
                sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>
                ::grow((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>
                        *)this);
                pVar15 = emplace<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>>
                                   (this,&local_48);
                return pVar15;
              }
            }
            cVar12 = psVar11[1].distance_from_desired;
            psVar10 = psVar11 + 1;
          } while (-1 < cVar12);
        }
        *(undefined8 *)((long)&psVar11[1].field_1 + 0x20) = local_48.second._16_8_;
        psVar11[1].field_1.value.second.
        super_span<const_slang::parsing::Token,_18446744073709551615UL>.data_ =
             local_48.second.super_span<const_slang::parsing::Token,_18446744073709551615UL>.data_;
        psVar11[1].field_1.value.second.
        super_span<const_slang::parsing::Token,_18446744073709551615UL>.size_ =
             local_48.second.super_span<const_slang::parsing::Token,_18446744073709551615UL>.size_;
        psVar11[1].field_1.value.first._M_len = local_48.first._M_len;
        psVar11[1].field_1.value.first._M_str = local_48.first._M_str;
        psVar10->distance_from_desired = (int8_t)sVar8;
      }
      *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
      pVar15._9_7_ = (int7)((ulong)psVar10 >> 8);
      pVar15.second = true;
      pVar15.first.current = current_entry;
      return pVar15;
    }
  }
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>
  ::grow((sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens>_>,_8UL>_>
          *)this);
  pVar15 = emplace<std::basic_string_view<char,std::char_traits<char>>&,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
                     (this,key,args);
  return pVar15;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }